

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

string * __thiscall
vkt::tessellation::(anonymous_namespace)::getProgramDescription_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,Winding winding,
          bool usePointMode)

{
  ostream *poVar1;
  char *pcVar2;
  ostringstream local_190 [8];
  ostringstream str;
  bool usePointMode_local;
  Winding winding_local;
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar1 = std::operator<<((ostream *)local_190,"winding mode ");
  pcVar2 = getWindingShaderName((Winding)this);
  poVar1 = std::operator<<(poVar1,pcVar2);
  poVar1 = std::operator<<(poVar1,", ");
  pcVar2 = "don\'t ";
  if ((winding & WINDING_CW) != WINDING_CCW) {
    pcVar2 = "";
  }
  poVar1 = std::operator<<(poVar1,pcVar2);
  std::operator<<(poVar1,"use point mode");
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

inline std::string getProgramDescription (const Winding winding, const bool usePointMode)
{
	std::ostringstream str;
	str << "winding mode " << getWindingShaderName(winding) << ", " << (usePointMode ? "" : "don't ") << "use point mode";
	return str.str();
}